

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

ktx_error_code_e
optimalTilingCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  user_cbdata_optimal *ud;
  ktx_uint64_t faceLodSize_local;
  int depth_local;
  int height_local;
  int width_local;
  int face_local;
  int miplevel_local;
  
  **userdata = *(undefined8 *)((long)userdata + 8);
  *(ktx_uint64_t *)((long)userdata + 8) = faceLodSize + *(long *)((long)userdata + 8);
  *(undefined4 *)(*userdata + 8) = 0;
  *(undefined4 *)(*userdata + 0xc) = 0;
  *(undefined4 *)(*userdata + 0x10) = 1;
  *(int *)(*userdata + 0x14) = miplevel;
  *(int *)(*userdata + 0x18) = face;
  *(int *)(*userdata + 0x1c) = *(int *)((long)userdata + 0x14) * *(int *)((long)userdata + 0x10);
  *(undefined4 *)(*userdata + 0x20) = 0;
  *(undefined4 *)(*userdata + 0x24) = 0;
  *(undefined4 *)(*userdata + 0x28) = 0;
  *(int *)(*userdata + 0x2c) = width;
  *(int *)(*userdata + 0x30) = height;
  *(int *)(*userdata + 0x34) = depth;
  *(long *)userdata = *userdata + 0x38;
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code
optimalTilingCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_optimal* ud = (user_cbdata_optimal*)userdata;
    UNUSED(pixels);

    // Set up copy to destination region in final image
#if defined(_DEBUG)
    assert(ud->region < ud->regionsArrayEnd);
#endif
    ud->region->bufferOffset = ud->offset;
    ud->offset += faceLodSize;
    // These 2 are expressed in texels.
    ud->region->bufferRowLength = 0;
    ud->region->bufferImageHeight = 0;
    ud->region->imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    ud->region->imageSubresource.mipLevel = miplevel;
    ud->region->imageSubresource.baseArrayLayer = face;
    ud->region->imageSubresource.layerCount = ud->numLayers * ud->numFaces;
    ud->region->imageOffset.x = 0;
    ud->region->imageOffset.y = 0;
    ud->region->imageOffset.z = 0;
    ud->region->imageExtent.width = width;
    ud->region->imageExtent.height = height;
    ud->region->imageExtent.depth = depth;

    ud->region += 1;

    return KTX_SUCCESS;
}